

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::ReadFaces_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData)

{
  float *pfVar1;
  float fVar2;
  uchar *puVar3;
  pointer paVar4;
  pointer puVar5;
  pointer paVar6;
  ushort uVar7;
  Logger *pLVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  Triangle_MDL7 *pTVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  long local_58;
  
  puVar3 = this->mBuffer;
  pTVar12 = groupInfo->pcGroupTris;
  uVar10 = 0;
  local_58 = 8;
  iVar11 = 0;
  do {
    if ((uint)groupInfo->pcGroup->numtris <= uVar10) {
      return;
    }
    lVar15 = local_58;
    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
      uVar13 = (uint)pTVar12->v_index[lVar16];
      uVar9 = groupInfo->pcGroup->numverts;
      if (uVar9 < pTVar12->v_index[lVar16]) {
        uVar13 = uVar9 - 1;
        pTVar12->v_index[lVar16] = (uint16_t)uVar13;
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"Index overflow in MDL7 vertex list");
      }
      uVar9 = iVar11 + (int)lVar16;
      *(uint *)((long)((groupData->pcFaces).
                       super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                       ._M_impl.super__Vector_impl_data._M_start)->mIndices + lVar15) = uVar9;
      paVar4 = (groupData->vPositions).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar4[uVar9].x =
           *(float *)((long)&groupInfo->pcGroupVerts->x +
                     (ulong)(*(ushort *)(puVar3 + 0x28) * uVar13));
      paVar4[uVar9].y =
           *(float *)((long)&groupInfo->pcGroupVerts->y +
                     (ulong)(*(ushort *)(puVar3 + 0x28) * uVar13));
      paVar4[uVar9].z =
           *(float *)((long)&groupInfo->pcGroupVerts->z +
                     (ulong)(*(ushort *)(puVar3 + 0x28) * uVar13));
      puVar5 = (groupData->aiBones).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar5 != (groupData->aiBones).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        puVar5[uVar9] =
             (uint)*(ushort *)
                    ((long)&groupInfo->pcGroupVerts->vertindex +
                    (ulong)(*(ushort *)(puVar3 + 0x28) * uVar13));
      }
      uVar7 = *(ushort *)(puVar3 + 0x28);
      if (uVar7 < 0x1a) {
        if (0xf < uVar7) {
          MD2::LookupNormalIndex
                    (*(uint8_t *)((long)&groupInfo->pcGroupVerts->field_4 + (ulong)(uVar13 * uVar7))
                     ,(groupData->vNormals).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar9);
        }
      }
      else {
        paVar4 = (groupData->vNormals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar4[uVar9].x =
             *(float *)((long)&groupInfo->pcGroupVerts->field_4 + (ulong)(uVar7 * uVar13));
        paVar4[uVar9].y =
             *(float *)((long)&groupInfo->pcGroupVerts->field_4 +
                       (ulong)(*(ushort *)(puVar3 + 0x28) * uVar13) + 4);
        paVar4[uVar9].z =
             *(float *)((long)&groupInfo->pcGroupVerts->field_4 +
                       (ulong)(*(ushort *)(puVar3 + 0x28) * uVar13) + 8);
      }
      uVar7 = *(ushort *)(puVar3 + 0x26);
      if (0xb < uVar7) {
        uVar13 = groupInfo->pcGroup->num_stpts;
        if (uVar13 != 0) {
          uVar7 = pTVar12->skinsets[0].st_index[lVar16];
          uVar14 = (uint)uVar7;
          if (uVar13 < uVar7) {
            uVar14 = uVar13 - 1;
            pLVar8 = DefaultLogger::get();
            Logger::warn(pLVar8,"Index overflow in MDL7 UV coordinate list (#1)");
          }
          fVar2 = groupInfo->pcGroupUVs[uVar14].v;
          (groupData->vTextureCoords1).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9].x = groupInfo->pcGroupUVs[uVar14].u;
          (groupData->vTextureCoords1).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9].y = 1.0 - fVar2;
          uVar7 = *(ushort *)(puVar3 + 0x26);
        }
        if (0xf < uVar7) {
          (groupData->pcFaces).
          super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10].iMatIndex[0] =
               pTVar12->skinsets[0].material;
          if (0x19 < *(ushort *)(puVar3 + 0x26)) {
            uVar13 = groupInfo->pcGroup->num_stpts;
            if (uVar13 != 0) {
              uVar7 = pTVar12->skinsets[1].st_index[lVar16];
              uVar14 = (uint)uVar7;
              if (uVar13 < uVar7) {
                uVar14 = uVar13 - 1;
                pLVar8 = DefaultLogger::get();
                Logger::warn(pLVar8,"Index overflow in MDL7 UV coordinate list (#2)");
              }
              fVar2 = groupInfo->pcGroupUVs[uVar14].u;
              fVar17 = 1.0 - groupInfo->pcGroupUVs[uVar14].v;
              (groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9].x = fVar2;
              (groupData->vTextureCoords2).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9].y = fVar17;
              if (uVar14 != 0) {
                paVar6 = (groupData->vTextureCoords1).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                paVar4 = paVar6 + uVar9;
                if ((fVar2 == paVar4->x) && (!NAN(fVar2) && !NAN(paVar4->x))) {
                  pfVar1 = &paVar6[uVar9].y;
                  if ((fVar17 == *pfVar1) && (!NAN(fVar17) && !NAN(*pfVar1))) goto LAB_0043ae85;
                }
                groupData->bNeed2UV = true;
              }
LAB_0043ae85:
              if (pTVar12->skinsets[1].material != pTVar12->skinsets[0].material) {
                groupData->bNeed2UV = true;
              }
            }
            (groupData->pcFaces).
            super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar10].iMatIndex[1] =
                 pTVar12->skinsets[1].material;
          }
        }
      }
      lVar15 = lVar15 + -4;
    }
    pTVar12 = (Triangle_MDL7 *)((long)pTVar12->v_index + (ulong)*(ushort *)(puVar3 + 0x26));
    uVar10 = uVar10 + 1;
    local_58 = local_58 + 0x14;
    iVar11 = iVar11 + 3;
  } while( true );
}

Assistant:

void MDLImporter::ReadFaces_3DGS_MDL7(const MDL::IntGroupInfo_MDL7& groupInfo,
    MDL::IntGroupData_MDL7& groupData)
{
    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    MDL::Triangle_MDL7* pcGroupTris = groupInfo.pcGroupTris;

    // iterate through all triangles and build valid display lists
    unsigned int iOutIndex = 0;
    for (unsigned int iTriangle = 0; iTriangle < (unsigned int)groupInfo.pcGroup->numtris; ++iTriangle) {
        AI_SWAP2(pcGroupTris->v_index[0]);
        AI_SWAP2(pcGroupTris->v_index[1]);
        AI_SWAP2(pcGroupTris->v_index[2]);

        // iterate through all indices of the current triangle
        for (unsigned int c = 0; c < 3;++c,++iOutIndex) {

            // validate the vertex index
            unsigned int iIndex = pcGroupTris->v_index[c];
            if(iIndex > (unsigned int)groupInfo.pcGroup->numverts)  {
                // (we might need to read this section a second time - to process frame vertices correctly)
                pcGroupTris->v_index[c] = iIndex = groupInfo.pcGroup->numverts-1;
                ASSIMP_LOG_WARN("Index overflow in MDL7 vertex list");
            }

            // write the output face index
            groupData.pcFaces[iTriangle].mIndices[2-c] = iOutIndex;

            aiVector3D& vPosition = groupData.vPositions[ iOutIndex ];
            vPosition.x = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex, pcHeader->mainvertex_stc_size) .x;
            vPosition.y = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .y;
            vPosition.z = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .z;

            // if we have bones, save the index
            if (!groupData.aiBones.empty()) {
                groupData.aiBones[iOutIndex] = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,
                    iIndex,pcHeader->mainvertex_stc_size).vertindex;
            }

            // now read the normal vector
            if (AI_MDL7_FRAMEVERTEX030305_STCSIZE <= pcHeader->mainvertex_stc_size) {
                // read the full normal vector
                aiVector3D& vNormal = groupData.vNormals[ iOutIndex ];
                vNormal.x = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .norm[0];
                AI_SWAP4(vNormal.x);
                vNormal.y = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .norm[1];
                AI_SWAP4(vNormal.y);
                vNormal.z = _AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,pcHeader->mainvertex_stc_size) .norm[2];
                AI_SWAP4(vNormal.z);
            }
            else if (AI_MDL7_FRAMEVERTEX120503_STCSIZE <= pcHeader->mainvertex_stc_size)    {
                // read the normal vector from Quake2's smart table
                aiVector3D& vNormal = groupData.vNormals[ iOutIndex ];
                MD2::LookupNormalIndex(_AI_MDL7_ACCESS_VERT(groupInfo.pcGroupVerts,iIndex,
                    pcHeader->mainvertex_stc_size) .norm162index,vNormal);
            }
            // validate and process the first uv coordinate set
            if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_ONE_UV)    {

                if (groupInfo.pcGroup->num_stpts)   {
                    AI_SWAP2(pcGroupTris->skinsets[0].st_index[0]);
                    AI_SWAP2(pcGroupTris->skinsets[0].st_index[1]);
                    AI_SWAP2(pcGroupTris->skinsets[0].st_index[2]);

                    iIndex = pcGroupTris->skinsets[0].st_index[c];
                    if(iIndex > (unsigned int)groupInfo.pcGroup->num_stpts) {
                        iIndex = groupInfo.pcGroup->num_stpts-1;
                        ASSIMP_LOG_WARN("Index overflow in MDL7 UV coordinate list (#1)");
                    }

                    float u = groupInfo.pcGroupUVs[iIndex].u;
                    float v = 1.0f-groupInfo.pcGroupUVs[iIndex].v; // DX to OGL

                    groupData.vTextureCoords1[iOutIndex].x = u;
                    groupData.vTextureCoords1[iOutIndex].y = v;
                }
                // assign the material index, but only if it is existing
                if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_ONE_UV_WITH_MATINDEX){
                    AI_SWAP4(pcGroupTris->skinsets[0].material);
                    groupData.pcFaces[iTriangle].iMatIndex[0] = pcGroupTris->skinsets[0].material;
                }
            }
            // validate and process the second uv coordinate set
            if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_TWO_UV)    {

                if (groupInfo.pcGroup->num_stpts)   {
                    AI_SWAP2(pcGroupTris->skinsets[1].st_index[0]);
                    AI_SWAP2(pcGroupTris->skinsets[1].st_index[1]);
                    AI_SWAP2(pcGroupTris->skinsets[1].st_index[2]);
                    AI_SWAP4(pcGroupTris->skinsets[1].material);

                    iIndex = pcGroupTris->skinsets[1].st_index[c];
                    if(iIndex > (unsigned int)groupInfo.pcGroup->num_stpts) {
                        iIndex = groupInfo.pcGroup->num_stpts-1;
                        ASSIMP_LOG_WARN("Index overflow in MDL7 UV coordinate list (#2)");
                    }

                    float u = groupInfo.pcGroupUVs[ iIndex ].u;
                    float v = 1.0f-groupInfo.pcGroupUVs[ iIndex ].v;

                    groupData.vTextureCoords2[ iOutIndex ].x = u;
                    groupData.vTextureCoords2[ iOutIndex ].y = v; // DX to OGL

                    // check whether we do really need the second texture
                    // coordinate set ... wastes memory and loading time
                    if (0 != iIndex && (u != groupData.vTextureCoords1[ iOutIndex ].x ||
                        v != groupData.vTextureCoords1[ iOutIndex ].y ) )
                        groupData.bNeed2UV = true;

                    // if the material differs, we need a second skin, too
                    if (pcGroupTris->skinsets[ 1 ].material != pcGroupTris->skinsets[ 0 ].material)
                        groupData.bNeed2UV = true;
                }
                // assign the material index
                groupData.pcFaces[ iTriangle ].iMatIndex[ 1 ] = pcGroupTris->skinsets[ 1 ].material;
            }
        }
        // get the next triangle in the list
        pcGroupTris = (MDL::Triangle_MDL7*)((const char*)pcGroupTris + pcHeader->triangle_stc_size);
    }
}